

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> * __thiscall
kj::ArrayBuilder<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry>::operator=
          (ArrayBuilder<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *this,
          ArrayBuilder<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *other)

{
  ArrayBuilder<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *other_local;
  ArrayBuilder<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Entry *)0x0;
  other->pos = (RemoveConst<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *)0x0;
  other->endPtr = (Entry *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }